

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall
Fl_Text_Display::count_lines(Fl_Text_Display *this,int startPos,int endPos,bool startPosIsLineStart)

{
  int iVar1;
  int retLineEnd;
  int retLineStart;
  int retPos;
  int retLines;
  
  if (this->mContinuousWrap != 0) {
    wrapped_line_counter
              (this,this->mBuffer,startPos,endPos,0x7fffffff,startPosIsLineStart,0,&retPos,&retLines
               ,&retLineStart,&retLineEnd,true);
    return retLines;
  }
  iVar1 = Fl_Text_Buffer::count_lines(this->mBuffer,startPos,endPos);
  return iVar1;
}

Assistant:

int Fl_Text_Display::count_lines(int startPos, int endPos,
                                 bool startPosIsLineStart) const {
  IS_UTF8_ALIGNED2(buffer(), startPos)
  IS_UTF8_ALIGNED2(buffer(), endPos)

  int retLines, retPos, retLineStart, retLineEnd;

#ifdef DEBUG
  printf("Fl_Text_Display::count_lines(startPos=%d, endPos=%d, startPosIsLineStart=%d\n",
         startPos, endPos, startPosIsLineStart);
#endif // DEBUG

  /* If we're not wrapping use simple (and more efficient) Fl_Text_Buffer::count_lines() */
  if (!mContinuousWrap)
    return buffer()->count_lines(startPos, endPos);

  wrapped_line_counter(buffer(), startPos, endPos, INT_MAX,
                       startPosIsLineStart, 0, &retPos, &retLines, &retLineStart,
                       &retLineEnd);

#ifdef DEBUG
  printf("   # after WLC: retPos=%d, retLines=%d, retLineStart=%d, retLineEnd=%d\n",
         retPos, retLines, retLineStart, retLineEnd);
#endif // DEBUG

  return retLines;
}